

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<mp::var::Type>>,std::tuple<int,mp::var::Type>>
               (tuple<testing::Matcher<int>,_testing::Matcher<mp::var::Type>_> *matchers,
               tuple<int,_mp::var::Type> *values,ostream *os)

{
  uint uVar1;
  MatcherInterface<int> *pMVar2;
  int iVar3;
  ostream *poVar4;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<int> local_1f0;
  string local_1d8;
  StringMatchResultListener local_1b8;
  
  Matcher<int>::Matcher
            ((Matcher<int> *)&local_1f0,
             &(matchers->
              super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>).
              super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl);
  uVar1 = (values->super__Tuple_impl<0UL,_int,_mp::var::Type>).super__Head_base<0UL,_int,_false>.
          _M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&local_1b8);
  iVar3 = (*((local_1f0.impl_.value_)->super_MatcherDescriberInterface).
            _vptr_MatcherDescriberInterface[4])(local_1f0.impl_.value_,(ulong)uVar1,&local_1b8);
  if ((char)iVar3 == '\0') {
    poVar4 = std::operator<<(os,"  Expected arg #");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,": ");
    pMVar2 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<mp::var::Type>_>).
             super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>
             .impl_.value_;
    (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar2,os);
    std::operator<<(os,"\n           Actual: ");
    std::ostream::operator<<(os,uVar1);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d8,os);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b8);
  MatcherBase<int>::~MatcherBase(&local_1f0);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }